

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

BOOL __thiscall
Memory::Recycler::TryFinishConcurrentCollect<(Memory::CollectionFlags)404852739>(Recycler *this)

{
  size_t *psVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  code *pcVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  DWORD DVar9;
  int iVar10;
  DWORD DVar11;
  uint uVar12;
  undefined4 *unaff_R14;
  
  if ((this->collectionState).value == CollectionStateNotCollecting) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    unaff_R14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *unaff_R14 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x122b,"(this->CollectionInProgress())","this->CollectionInProgress()");
    if (!bVar7) goto LAB_0072f986;
    *unaff_R14 = 0;
  }
  psVar1 = &(this->collectionStats).finishCollectTryCount;
  *psVar1 = *psVar1 + 1;
  SetupPostCollectionFlags<(Memory::CollectionFlags)404852739>(this);
  if (((this->enableConcurrentMark == false) && (this->enableParallelMark == false)) &&
     (this->enableConcurrentSweep == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    unaff_R14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *unaff_R14 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1233,"(this->IsConcurrentEnabled())","this->IsConcurrentEnabled()");
    if (!bVar7) goto LAB_0072f986;
    *unaff_R14 = 0;
  }
  if ((((this->collectionState).value & Collection_Concurrent) == CollectionStateNotCollecting) &&
     (this->isCollectionDisabled == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    unaff_R14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *unaff_R14 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1234,"(IsConcurrentState() || IsCollectionDisabled())",
                       "IsConcurrentState() || IsCollectionDisabled()");
    if (!bVar7) {
LAB_0072f986:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *unaff_R14 = 0;
  }
  uVar12 = (uint)unaff_R14;
  if (this->concurrentThread != (HANDLE)0x0) {
    if (((this->collectionState).value & Collection_ExecutingConcurrent) !=
        CollectionStateNotCollecting) {
      if ((this->priorityBoost == false) &&
         ((DVar9 = GetTickCount(),
          RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost <
          (this->autoHeap).uncollectedAllocBytes ||
          (uVar3 = this->tickCountStartConcurrent,
          DVar11 = RecyclerHeuristic::PriorityBoostTimeout(this->recyclerFlagsTable),
          DVar11 < DVar9 - uVar3)))) {
        bVar7 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase);
        if (bVar7) {
          Output::Print(L"%04X> RC(%p): %s: ",this->mainThreadId,this,L"Set priority normal");
          uVar4 = (this->autoHeap).uncollectedAllocBytes;
          if (RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost < uVar4) {
            Output::Print(L"AllocBytes=%d (Time=%d)\n",uVar4,
                          (ulong)(DVar9 - this->tickCountStartConcurrent));
          }
          else {
            Output::Print(L"Time=%d (AllocBytes=%d\n");
          }
        }
        this->priorityBoost = true;
        SetThreadPriority(this->concurrentThread,0);
      }
      (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0x12])();
      bVar7 = this->hasDisposableObject;
      if (bVar7 == true) {
        this->allowDispose = true;
        this->inDisposeWrapper = true;
        bVar8 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase);
        if (bVar8) {
          Output::Print(L"%04X> RC(%p): %s\n",this->mainThreadId,this,
                        L"Process delayed dispose object");
        }
        (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0xe])
                  (this->collectionWrapper,this);
        if ((((this->collectionState).value == CollectionStateNotCollecting) &&
            (this->inExhaustiveCollection == true)) && ((this->hasExhaustiveCandidate & 1U) != 0)) {
          (this->collectionParam).priorityBoostConcurrentSweepOverride = false;
          (this->collectionParam).finishOnly = false;
          (this->collectionParam).repeat = true;
          (this->collectionParam).flags =
               CollectMode_Concurrent|CollectOverride_FinishConcurrentTimeout|
               CollectOverride_AllowReentrant|CollectNowDefaultLSCleanup|CollectHeuristic_Time|
               CollectHeuristic_AllocSize;
          (this->collectionParam).uncollectedAllocBytes = (this->autoHeap).uncollectedAllocBytes;
          (this->collectionParam).uncollectedNewPageCountPartialCollect =
               this->uncollectedNewPageCountPartialCollect;
          (this->collectionParam).inPartialCollectMode = this->inPartialCollectMode;
          sVar6 = (this->autoHeap).unusedPartialCollectFreeBytes;
          (this->collectionParam).uncollectedNewPageCount = (this->autoHeap).uncollectedNewPageCount
          ;
          (this->collectionParam).unusedPartialCollectFreeBytes = sVar6;
          DoCollectWrapped(this,CollectMode_Concurrent|CollectOverride_FinishConcurrentTimeout|
                                CollectOverride_AllowReentrant|CollectNowDefaultLSCleanup|
                                CollectHeuristic_Time|CollectHeuristic_AllocSize);
        }
        this->inDisposeWrapper = false;
      }
      return (uint)bVar7;
    }
    DVar9 = GetTickCount();
    uVar2 = this->tickCountNextFinishCollection;
    if (DVar9 <= uVar2) {
      (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0x12])();
      uVar12 = (uint)this->hasDisposableObject;
      if (this->hasDisposableObject == true) {
        this->allowDispose = true;
        this->inDisposeWrapper = true;
        bVar7 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase);
        if (bVar7) {
          Output::Print(L"%04X> RC(%p): %s\n",this->mainThreadId,this,
                        L"Process delayed dispose object");
        }
        (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0xe])
                  (this->collectionWrapper,this);
        if ((((this->collectionState).value == CollectionStateNotCollecting) &&
            (this->inExhaustiveCollection == true)) && ((this->hasExhaustiveCandidate & 1U) != 0)) {
          (this->collectionParam).priorityBoostConcurrentSweepOverride = false;
          (this->collectionParam).finishOnly = false;
          (this->collectionParam).repeat = true;
          (this->collectionParam).flags =
               CollectMode_Concurrent|CollectOverride_FinishConcurrentTimeout|
               CollectOverride_AllowReentrant|CollectNowDefaultLSCleanup|CollectHeuristic_Time|
               CollectHeuristic_AllocSize;
          (this->collectionParam).uncollectedAllocBytes = (this->autoHeap).uncollectedAllocBytes;
          (this->collectionParam).uncollectedNewPageCountPartialCollect =
               this->uncollectedNewPageCountPartialCollect;
          (this->collectionParam).inPartialCollectMode = this->inPartialCollectMode;
          sVar6 = (this->autoHeap).unusedPartialCollectFreeBytes;
          (this->collectionParam).uncollectedNewPageCount = (this->autoHeap).uncollectedNewPageCount
          ;
          (this->collectionParam).unusedPartialCollectFreeBytes = sVar6;
          DoCollectWrapped(this,CollectMode_Concurrent|CollectOverride_FinishConcurrentTimeout|
                                CollectOverride_AllowReentrant|CollectNowDefaultLSCleanup|
                                CollectHeuristic_Time|CollectHeuristic_AllocSize);
        }
        this->inDisposeWrapper = false;
      }
    }
    if (DVar9 <= uVar2) {
      return uVar12;
    }
  }
  this->allowDispose = true;
  this->skipStack = false;
  this->isConcurrentGCOnIdle = false;
  iVar10 = (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[9])
                     (this->collectionWrapper,this,FinishConcurrentCollect,0,0x18219003);
  return iVar10;
}

Assistant:

BOOL
Recycler::TryFinishConcurrentCollect()
{
    Assert(this->CollectionInProgress());

    RECYCLER_STATS_INC(this, finishCollectTryCount);

    SetupPostCollectionFlags<flags>();
    const BOOL concurrent = flags & CollectMode_Concurrent;
    const BOOL forceInThread = flags & CollectOverride_ForceInThread;

    Assert(this->IsConcurrentEnabled());
    Assert(IsConcurrentState() || IsCollectionDisabled());
    Assert(!concurrent || !forceInThread);
    if (concurrent && concurrentThread != NULL)
    {
        if (IsConcurrentExecutingState())
        {
            if (!this->priorityBoost)
            {
                uint tickCount = GetTickCount();
                if ((autoHeap.uncollectedAllocBytes > RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost)
                    || (tickCount - this->tickCountStartConcurrent > RecyclerHeuristic::PriorityBoostTimeout(this->GetRecyclerFlagsTable())))
                {

    #ifdef RECYCLER_TRACE
                    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::RecyclerPhase))
                    {
                        Output::Print(_u("%04X> RC(%p): %s: "), this->mainThreadId, this, _u("Set priority normal"));
                        if (autoHeap.uncollectedAllocBytes > RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost)
                        {
                            Output::Print(_u("AllocBytes=%d (Time=%d)\n"), autoHeap.uncollectedAllocBytes, tickCount - this->tickCountStartConcurrent);
                        }
                        else
                        {
                            Output::Print(_u("Time=%d (AllocBytes=%d\n"), tickCount - this->tickCountStartConcurrent, autoHeap.uncollectedAllocBytes);
                        }
                    }
    #endif
                    // Set it to a large number so we don't set the thread priority again
                    this->priorityBoost = true;

                    // The recycler thread hasn't come back in 5 seconds
                    // It either has a large object graph, or it is starving.
                    // Set the priority back to normal
                    SetThreadPriority(this->concurrentThread, THREAD_PRIORITY_NORMAL);
                }
            }

            return FinishDisposeObjectsWrapped<flags>();
        }
        else if ((flags & CollectOverride_FinishConcurrentTimeout) != 0)
        {
            uint tickCount = GetTickCount();

            // If we haven't gone past the time to call finish collection,
            // simply call FinishDisposeObjects and return
            // Otherwise, actually go ahead and call FinishConcurrentCollectWrapped
            // We do this only if this is a collection that allows finish concurrent to timeout
            // If not, by default, we finish the collection
            if (tickCount <= this->tickCountNextFinishCollection)
            {
                return FinishDisposeObjectsWrapped<flags>();
            }
        }
    }

    return FinishConcurrentCollectWrapped(flags);
}